

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O2

void __thiscall
HashUtil_Ripemd160String_Test::HashUtil_Ripemd160String_Test(HashUtil_Ripemd160String_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_006f4038;
  return;
}

Assistant:

TEST(HashUtil, Ripemd160String) {
  ByteData160 byte_data = HashUtil::Ripemd160("The quick brown fox jumps over the lazy dog");
  EXPECT_STREQ(byte_data.GetHex().c_str(),
               "37f332f68db77bd9d7edd4969571ad671cf9dd3b");

  byte_data = HashUtil::Ripemd160("The quick brown fox jumps over the lazy cog");
  EXPECT_STREQ(byte_data.GetHex().c_str(),
               "132072df690933835eb8b6ad0b77e7b6f14acad7");

  byte_data = HashUtil::Ripemd160("");
  EXPECT_STREQ(byte_data.GetHex().c_str(),
               "9c1185a5c5e9fc54612808977ee8f548b2258d31");
}